

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O0

int nng_listener_start(nng_listener lid,int flags)

{
  int iVar1;
  nni_listener *pnStack_20;
  int rv;
  nni_listener *l;
  uint32_t local_10;
  int flags_local;
  nng_listener lid_local;
  
  l._4_4_ = flags;
  local_10 = lid.id;
  flags_local = nni_listener_find(&stack0xffffffffffffffe0,lid.id);
  if (flags_local == 0) {
    iVar1 = nni_listener_start(pnStack_20,l._4_4_);
    nni_listener_rele(pnStack_20);
    flags_local = iVar1;
  }
  return flags_local;
}

Assistant:

int
nng_listener_start(nng_listener lid, int flags)
{
	nni_listener *l;
	int           rv;

	if ((rv = nni_listener_find(&l, lid.id)) != 0) {
		return (rv);
	}
	rv = nni_listener_start(l, flags);
	nni_listener_rele(l);
	return (rv);
}